

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall BotscriptParser::writeMemberBuffers(BotscriptParser *this)

{
  DataBuffer **ppDVar1;
  bool bVar2;
  reference pppDVar3;
  DataBuffer *pDVar4;
  DataBuffer **bufp;
  Iterator __end1;
  undefined1 local_a8 [8];
  Iterator __begin1;
  initializer_list<DataBuffer_**> local_78;
  List<DataBuffer_**> local_68;
  List<DataBuffer_**> *local_18;
  List<DataBuffer_**> *__range1;
  BotscriptParser *this_local;
  
  __range1 = (List<DataBuffer_**> *)this;
  if ((this->m_gotMainLoop & 1U) == 0) {
    DataBuffer::writeHeader(this->m_mainLoopBuffer,MainLoop);
    DataBuffer::writeHeader(this->m_mainLoopBuffer,EndMainLoop);
  }
  __begin1._M_node = (_Map_pointer)&this->m_onenterBuffer;
  local_78._M_array = (iterator)&__begin1._M_node;
  local_78._M_len = 2;
  List<DataBuffer_**>::List(&local_68,&local_78);
  local_18 = &local_68;
  List<DataBuffer_**>::begin((Iterator *)local_a8,&local_68);
  List<DataBuffer_**>::end((Iterator *)&bufp,local_18);
  while( true ) {
    bVar2 = std::operator!=((_Self *)local_a8,(_Self *)&bufp);
    if (!bVar2) break;
    pppDVar3 = std::_Deque_iterator<DataBuffer_**,_DataBuffer_**&,_DataBuffer_***>::operator*
                         ((_Deque_iterator<DataBuffer_**,_DataBuffer_**&,_DataBuffer_***> *)local_a8
                         );
    ppDVar1 = *pppDVar3;
    pDVar4 = currentBuffer(this);
    DataBuffer::mergeAndDestroy(pDVar4,*ppDVar1);
    pDVar4 = (DataBuffer *)operator_new(0xb8);
    DataBuffer::DataBuffer(pDVar4,0x80);
    *ppDVar1 = pDVar4;
    std::_Deque_iterator<DataBuffer_**,_DataBuffer_**&,_DataBuffer_***>::operator++
              ((_Deque_iterator<DataBuffer_**,_DataBuffer_**&,_DataBuffer_***> *)local_a8);
  }
  List<DataBuffer_**>::~List(&local_68);
  this->m_gotMainLoop = false;
  return;
}

Assistant:

void BotscriptParser::writeMemberBuffers()
{
	// If there was no mainloop defined, write a dummy one now.
	if (m_gotMainLoop == false)
	{
		m_mainLoopBuffer->writeHeader (DataHeader::MainLoop);
		m_mainLoopBuffer->writeHeader (DataHeader::EndMainLoop);
	}

	// Write the onenter and mainloop buffers, in that order in particular.
	for (DataBuffer** bufp : List<DataBuffer**> ({&m_onenterBuffer, &m_mainLoopBuffer}))
	{
		currentBuffer()->mergeAndDestroy (*bufp);

		// Clear the buffer afterwards for potential next state
		*bufp = new DataBuffer;
	}

	// Next state definitely has no mainloop yet
	m_gotMainLoop = false;
}